

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser.cxx
# Opt level: O3

void __thiscall Fl_File_Chooser::type(Fl_File_Chooser *this,int t)

{
  this->type_ = t;
  (this->fileList->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.type_ =
       (byte)t & 1 | 2;
  if ((t & 2U) == 0) {
    Fl_Widget::deactivate(&this->newButton->super_Fl_Widget);
  }
  else {
    Fl_Widget::activate(&this->newButton->super_Fl_Widget);
  }
  *(uint *)&(this->fileList->super_Fl_Browser).field_0x29c = (uint)t >> 2 & 1;
  return;
}

Assistant:

void Fl_File_Chooser::type(int t) {
  type_ = t;
  if (t & MULTI)
    fileList->type(FL_MULTI_BROWSER);
  else
    fileList->type(FL_HOLD_BROWSER);
  if (t & CREATE)
    newButton->activate();
  else
    newButton->deactivate();
  if (t & DIRECTORY)
    fileList->filetype(Fl_File_Browser::DIRECTORIES);
  else
    fileList->filetype(Fl_File_Browser::FILES);
}